

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TheoryAxioms.cpp
# Opt level: O0

void __thiscall
Shell::TheoryAxioms::addQuotientAxioms
          (TheoryAxioms *this,Interpretation quotient,Interpretation multiply,TermList zeroElement,
          TermList oneElement,Interpretation less)

{
  initializer_list<Kernel::Literal_*> lits;
  initializer_list<Kernel::Literal_*> lits_00;
  TermList TVar1;
  Literal *pLVar2;
  undefined8 in_RCX;
  Term *in_RDI;
  Literal *qmxisy;
  TermList qmx;
  TermList myx;
  Literal *oQxnot0;
  TermList q1X;
  Literal *guardx;
  uint divFun;
  uint mulFun;
  TermList y;
  TermList x;
  TermList srt;
  Signature *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffee0;
  uint fn;
  TermList in_stack_fffffffffffffee8;
  TermList in_stack_fffffffffffffef0;
  undefined8 in_stack_ffffffffffffff18;
  undefined1 polarity;
  TermList in_stack_ffffffffffffff20;
  TermList in_stack_ffffffffffffff28;
  TermList in_stack_ffffffffffffff30;
  undefined8 local_c8;
  undefined1 uStack_c1;
  Literal *local_c0;
  Literal *local_b8;
  Literal **local_b0;
  undefined8 local_a8;
  uint64_t local_a0;
  size_type sVar3;
  TheoryAxioms *local_70;
  uint64_t local_40;
  size_type local_38;
  
  fn = (uint)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  polarity = (undefined1)((ulong)in_stack_ffffffffffffff18 >> 0x38);
  TVar1 = Kernel::Theory::getOperationSort((Interpretation)((ulong)in_RDI >> 0x20));
  Kernel::TermList::TermList
            ((TermList *)in_stack_fffffffffffffed0,(uint)((ulong)in_RDI >> 0x20),
             SUB81((ulong)in_RDI >> 0x18,0));
  Kernel::TermList::TermList
            ((TermList *)in_stack_fffffffffffffed0,(uint)((ulong)in_RDI >> 0x20),
             SUB81((ulong)in_RDI >> 0x18,0));
  Kernel::Signature::getInterpretingSymbol
            (in_stack_fffffffffffffed0,(Interpretation)((ulong)in_RDI >> 0x20));
  Kernel::Signature::getInterpretingSymbol
            (in_stack_fffffffffffffed0,(Interpretation)((ulong)in_RDI >> 0x20));
  pLVar2 = Kernel::Literal::createEquality
                     ((bool)polarity,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                      in_stack_ffffffffffffff20);
  sVar3 = local_38;
  Kernel::Term::create2(fn,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  Kernel::TermList::TermList((TermList *)in_stack_fffffffffffffed0,in_RDI);
  local_a0 = TVar1._content;
  local_b8 = Kernel::Literal::createEquality
                       ((bool)polarity,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                        in_stack_ffffffffffffff20);
  local_b0 = &local_c0;
  local_a8 = 2;
  lits._M_len = sVar3;
  lits._M_array = (iterator)local_b8;
  local_c0 = pLVar2;
  pLVar2 = local_b8;
  addTheoryClauseFromLits(local_70,lits,(InferenceRule)((ulong)in_RCX >> 0x38),(uint)in_RCX);
  Kernel::Term::create2(fn,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  Kernel::TermList::TermList((TermList *)in_stack_fffffffffffffed0,in_RDI);
  Kernel::Term::create2(fn,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  Kernel::TermList::TermList((TermList *)in_stack_fffffffffffffed0,in_RDI);
  Kernel::Literal::createEquality
            ((bool)uStack_c1,(TermList)local_40,(TermList)local_38,in_stack_ffffffffffffff20);
  lits_00._M_len = sVar3;
  lits_00._M_array = (iterator)pLVar2;
  addTheoryClauseFromLits(local_70,lits_00,(InferenceRule)((ulong)in_RCX >> 0x38),(uint)in_RCX);
  return;
}

Assistant:

void TheoryAxioms::addQuotientAxioms(Interpretation quotient, Interpretation multiply,
    TermList zeroElement, TermList oneElement, Interpretation less)
{
  TermList srt = theory->getOperationSort(quotient);
  ASS_EQ(srt, theory->getOperationSort(multiply));
  ASS_EQ(srt, theory->getOperationSort(less));

  TermList x(1,false);
  TermList y(2,false);

  unsigned mulFun = env.signature->getInterpretingSymbol(multiply);
  unsigned divFun = env.signature->getInterpretingSymbol(quotient);

  Literal* guardx = Literal::createEquality(true,x,zeroElement,srt); 

  // x=0 | quotient(x,x)=1, easily derivable!
  //TermList qXX(Term::create2(quotient,x,x));
  //Literal* xQxis1 = Literal::createEquality(true,qXX,oneElement,srt);
  //addTheoryNonUnitClause(guardx,xQxis1);

  // x=0 | quotient(1,x)!=0
  TermList q1X(Term::create2(divFun,oneElement,x));
  Literal* oQxnot0 = Literal::createEquality(false,q1X,zeroElement,srt);
  addTheoryClauseFromLits({guardx,oQxnot0}, InferenceRule::THA_QUOTIENT_NON_ZERO, EXPENSIVE);

  // quotient(x,1)=x, easily derivable!
  //TermList qX1(Term::create2(quotient,x,oneElement));
  //Literal* qx1isx = Literal::createEquality(true,qX1,x,srt);
  //addTheoryUnitClause(qx1isx);

  // x=0 | quotient(multiply(y,x),x)=y
  TermList myx(Term::create2(mulFun,y,x));
  TermList qmx(Term::create2(divFun,myx,x));
  Literal* qmxisy = Literal::createEquality(true,qmx,y,srt);

  addTheoryClauseFromLits({guardx,qmxisy}, InferenceRule::THA_QUOTIENT_MULTIPLY, EXPENSIVE);
}